

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_subpass_description_depth_stencil_resolve
          (Impl *this,Value *state,VkSubpassDescriptionDepthStencilResolve **out_info)

{
  bool bVar1;
  VkResolveModeFlagBits VVar2;
  VkSubpassDescriptionDepthStencilResolve *pVVar3;
  Type pGVar4;
  VkSubpassDescriptionDepthStencilResolve *info;
  VkSubpassDescriptionDepthStencilResolve **out_info_local;
  Value *state_local;
  Impl *this_local;
  
  pVVar3 = ScratchAllocator::allocate_cleared<VkSubpassDescriptionDepthStencilResolve>
                     (&this->allocator);
  *out_info = pVVar3;
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"depthResolveMode");
  VVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar4);
  pVVar3->depthResolveMode = VVar2;
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"stencilResolveMode");
  VVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar4);
  pVVar3->stencilResolveMode = VVar2;
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(state,"depthStencilResolveAttachment");
  if (bVar1) {
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"depthStencilResolveAttachment");
    bVar1 = parse_attachment2(this,pGVar4,&pVVar3->pDepthStencilResolveAttachment);
    if (!bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_subpass_description_depth_stencil_resolve(const Value &state,
                                                                          VkSubpassDescriptionDepthStencilResolve **out_info)
{
	auto *info = allocator.allocate_cleared<VkSubpassDescriptionDepthStencilResolve>();
	*out_info = info;

	info->depthResolveMode = static_cast<VkResolveModeFlagBits>(state["depthResolveMode"].GetUint());
	info->stencilResolveMode = static_cast<VkResolveModeFlagBits>(state["stencilResolveMode"].GetUint());

	if (state.HasMember("depthStencilResolveAttachment"))
	{
		if (!parse_attachment2(state["depthStencilResolveAttachment"], &info->pDepthStencilResolveAttachment))
			return false;
	}

	return true;
}